

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.h
# Opt level: O0

int GMRES<TPZMatrix<double>,TPZFMatrix<double>,TPZMatrixSolver<double>,TPZFMatrix<double>,double>
              (TPZMatrix<double> *A,TPZFMatrix<double> *x,TPZFMatrix<double> *b,
              TPZMatrixSolver<double> *M,TPZFMatrix<double> *H,int *m,int64_t *max_iter,double *tol,
              TPZFMatrix<double> *residual,int FromCurrent)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  int64_t iVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  ostream *poVar11;
  void *this;
  long *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  ulong uVar12;
  int *in_R9;
  double dVar13;
  REAL RVar14;
  long *in_stack_00000008;
  double *in_stack_00000010;
  TPZFMatrix<double> *in_stack_00000018;
  int in_stack_00000020;
  int64_t i_2;
  int64_t i_1;
  int64_t srows;
  int64_t i;
  int64_t rows;
  TPZFMatrix<double> *v;
  double beta;
  double normb;
  TPZFMatrix<double> *r;
  TPZFMatrix<double> *res;
  TPZFMatrix<double> resbackup;
  TPZFMatrix<double> w;
  TPZFMatrix<double> w1;
  TPZFMatrix<double> sn;
  TPZFMatrix<double> cs;
  TPZFMatrix<double> s;
  int64_t k;
  int64_t j;
  double resid;
  double *in_stack_fffffffffffffa38;
  TPZFMatrix<double> *in_stack_fffffffffffffa40;
  TPZFMatrix<double> *in_stack_fffffffffffffa48;
  TPZFMatrix<double> *pTVar15;
  TPZFMatrix<double> *in_stack_fffffffffffffa50;
  TPZFMatrix<double> *this_00;
  TPZFMatrix<double> *in_stack_fffffffffffffa58;
  TPZFMatrix<double> *in_stack_fffffffffffffa60;
  int64_t in_stack_fffffffffffffa68;
  TPZFMatrix<double> *in_stack_fffffffffffffa70;
  TPZMatrix<double> *in_stack_fffffffffffffa78;
  TPZFMatrix<double> *in_stack_fffffffffffffa80;
  TPZFMatrix<double> *in_stack_fffffffffffffb10;
  TPZFMatrix<double> *in_stack_fffffffffffffb18;
  TPZFMatrix<double> *in_stack_fffffffffffffb20;
  double *in_stack_fffffffffffffb28;
  TPZFMatrix<double> *in_stack_fffffffffffffb30;
  TPZFMatrix<double> *local_460;
  long local_418;
  int64_t local_410;
  long local_400;
  double local_3e0;
  double local_3d8;
  TPZFMatrix<double> *local_3c8;
  TPZFMatrix<double> local_3c0;
  TPZFMatrix<double> local_330;
  undefined1 local_2a0 [144];
  TPZFMatrix<double> local_210;
  TPZFMatrix<double> local_170;
  TPZFMatrix<double> local_e0;
  long local_50;
  long local_48;
  double local_40;
  int *local_38;
  long *local_28;
  undefined8 local_20;
  long *local_18;
  long *local_10;
  int local_4;
  
  local_48 = 1;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,(int64_t)in_stack_fffffffffffffa60)
  ;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,(int64_t)in_stack_fffffffffffffa60)
  ;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,(int64_t)in_stack_fffffffffffffa60)
  ;
  TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffa60);
  TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffa60);
  TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffa60);
  local_3c8 = in_stack_00000018;
  if (in_stack_00000018 == (TPZFMatrix<double> *)0x0) {
    local_3c8 = &local_3c0;
  }
  (**(code **)(*local_28 + 0x58))(local_28,local_20,local_3c8,0);
  dVar13 = Norm((TPZFMatrix<double> *)0x12dd821);
  local_3d8 = TPZExtractVal::val(dVar13);
  if (in_stack_00000020 == 0) {
    (**(code **)(*local_18 + 0x78))();
    TPZFMatrix<double>::operator=(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  }
  else {
    (**(code **)(*local_10 + 0x138))(0xbff0000000000000,local_10,local_18,local_20,local_3c8,0);
  }
  (**(code **)(*local_28 + 0x58))(local_28,local_3c8,&local_330,0);
  TPZFMatrix<double>::operator=(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  dVar13 = Norm((TPZFMatrix<double> *)0x12dd91e);
  local_3e0 = TPZExtractVal::val(dVar13);
  if ((local_3d8 == 0.0) && (!NAN(local_3d8))) {
    local_3d8 = 1.0;
  }
  dVar13 = Norm((TPZFMatrix<double> *)0x12dd972);
  RVar14 = TPZExtractVal::val(dVar13);
  local_40 = RVar14 / local_3d8;
  if (*in_stack_00000010 < local_40) {
    uVar3 = (ulong)(*local_38 + 1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x90),0);
    uVar12 = uVar4 + 8;
    if (0xfffffffffffffff7 < uVar4) {
      uVar12 = 0xffffffffffffffff;
    }
    if (SUB168(auVar2 * ZEXT816(0x90),8) != 0) {
      uVar12 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar12);
    *puVar5 = uVar3;
    this_00 = (TPZFMatrix<double> *)(puVar5 + 1);
    if (uVar3 != 0) {
      local_460 = this_00;
      do {
        TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffffa60);
        local_460 = local_460 + 1;
      } while (local_460 != this_00 + uVar3);
    }
    do {
      if (*in_stack_00000008 < local_48) {
        *in_stack_00000010 = local_40;
        if (this_00 != (TPZFMatrix<double> *)0x0) {
          uVar3 = *puVar5;
          pTVar15 = this_00 + uVar3;
          if (this_00 != pTVar15) {
            do {
              pTVar15 = pTVar15 + -1;
              TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de6c5);
            } while (pTVar15 != this_00);
          }
          operator_delete__(puVar5,uVar3 * 0x90 + 8);
        }
        local_4 = 1;
        goto LAB_012de709;
      }
      iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)local_3c8);
      (*(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0xd])(this_00,iVar6,1);
      for (local_400 = 0; local_400 < iVar6; local_400 = local_400 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()(local_3c8,local_400);
        RVar14 = TPZExtractVal::val(*pdVar7);
        pdVar7 = TPZFMatrix<double>::operator()(this_00,local_400);
        *pdVar7 = RVar14 * (1.0 / local_3e0);
      }
      iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)&local_e0);
      for (local_410 = 0; local_410 < iVar6; local_410 = local_410 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()(&local_e0,local_410);
        *pdVar7 = 0.0;
      }
      pdVar7 = TPZFMatrix<double>::operator()(&local_e0,0);
      *pdVar7 = local_3e0;
      local_418 = 0;
      while( true ) {
        bVar1 = false;
        if (local_418 < *local_38) {
          bVar1 = local_48 <= *in_stack_00000008;
        }
        if (!bVar1) break;
        (**(code **)(*local_10 + 0x128))(local_10,this_00 + local_418,local_2a0,0);
        (**(code **)(*local_28 + 0x58))(local_28,local_2a0,&local_330,0);
        for (local_50 = 0; local_50 <= local_418; local_50 = local_50 + 1) {
          dVar13 = Dot<double>(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
          pdVar7 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                              (int64_t)in_stack_fffffffffffffa40);
          *pdVar7 = dVar13;
          pdVar7 = TPZFMatrix<double>::operator()
                             (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                              (int64_t)in_stack_fffffffffffffa40);
          TPZFMatrix<double>::ZAXPY(&local_330,-*pdVar7,this_00 + local_50);
        }
        dVar13 = Norm((TPZFMatrix<double> *)0x12ddecd);
        pdVar7 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                            (int64_t)in_stack_fffffffffffffa40);
        *pdVar7 = dVar13;
        TPZFMatrix<double>::operator=(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
        pdVar7 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                            (int64_t)in_stack_fffffffffffffa40);
        RVar14 = TPZExtractVal::val(*pdVar7);
        (*this_00[local_418 + 1].super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x26])(1.0 / RVar14,this_00 + local_418 + 1);
        for (local_50 = 0; local_50 < local_418; local_50 = local_50 + 1) {
          in_stack_fffffffffffffb30 =
               (TPZFMatrix<double> *)
               TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                          (int64_t)in_stack_fffffffffffffa40);
          in_stack_fffffffffffffb28 =
               TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                          (int64_t)in_stack_fffffffffffffa40);
          in_stack_fffffffffffffb20 =
               (TPZFMatrix<double> *)TPZFMatrix<double>::operator()(&local_170,local_50);
          pdVar7 = TPZFMatrix<double>::operator()(&local_210,local_50);
          ApplyPlaneRotation<double>
                    ((double *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                     (double *)in_stack_fffffffffffffb20,pdVar7);
        }
        in_stack_fffffffffffffb18 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                        (int64_t)in_stack_fffffffffffffa40);
        in_stack_fffffffffffffb10 =
             (TPZFMatrix<double> *)
             TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                        (int64_t)in_stack_fffffffffffffa40);
        TPZFMatrix<double>::operator()(&local_170,local_418);
        TPZFMatrix<double>::operator()(&local_210,local_418);
        GeneratePlaneRotation<double>
                  ((double *)in_stack_fffffffffffffa50,(double *)in_stack_fffffffffffffa48,
                   (double *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
        pdVar7 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                            (int64_t)in_stack_fffffffffffffa40);
        pdVar8 = TPZFMatrix<double>::operator()
                           (in_stack_fffffffffffffa50,(int64_t)in_stack_fffffffffffffa48,
                            (int64_t)in_stack_fffffffffffffa40);
        pdVar9 = TPZFMatrix<double>::operator()(&local_170,local_418);
        pdVar10 = TPZFMatrix<double>::operator()(&local_210,local_418);
        ApplyPlaneRotation<double>(pdVar7,pdVar8,pdVar9,pdVar10);
        pdVar7 = TPZFMatrix<double>::operator()(&local_e0,local_418);
        pdVar8 = TPZFMatrix<double>::operator()(&local_e0,local_418 + 1);
        pdVar9 = TPZFMatrix<double>::operator()(&local_170,local_418);
        pdVar10 = TPZFMatrix<double>::operator()(&local_210,local_418);
        ApplyPlaneRotation<double>(pdVar7,pdVar8,pdVar9,pdVar10);
        pdVar7 = TPZFMatrix<double>::operator()(&local_e0,local_418 + 1);
        local_40 = ABS(*pdVar7) / local_3d8;
        if (local_40 < *in_stack_00000010) {
          Update<TPZFMatrix<double>,TPZFMatrix<double>>
                    (in_stack_fffffffffffffb30,(int64_t)in_stack_fffffffffffffb28,
                     in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
          *in_stack_00000010 = local_40;
          *in_stack_00000008 = local_48;
          if (this_00 != (TPZFMatrix<double> *)0x0) {
            uVar3 = *puVar5;
            for (pTVar15 = this_00 + uVar3; this_00 != pTVar15; pTVar15 = pTVar15 + -1) {
              TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de38d);
            }
            operator_delete__(puVar5,uVar3 * 0x90 + 8);
          }
          local_4 = 0;
          goto LAB_012de709;
        }
        local_418 = local_418 + 1;
        local_48 = local_48 + 1;
      }
      Update<TPZFMatrix<double>,TPZFMatrix<double>>
                (in_stack_fffffffffffffb30,(int64_t)in_stack_fffffffffffffb28,
                 in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
      (**(code **)(*local_10 + 0x138))(0xbff0000000000000,0,local_10,local_18,local_20,local_3c8,0);
      (**(code **)(*local_28 + 0x58))(local_28,local_3c8,local_3c8,0);
      dVar13 = Norm((TPZFMatrix<double> *)0x12de4b8);
      local_3e0 = TPZExtractVal::val(dVar13);
      local_40 = local_3e0 / local_3d8;
    } while (*in_stack_00000010 <= local_40);
    poVar11 = std::operator<<((ostream *)&std::cout,"iter ");
    poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_48);
    poVar11 = std::operator<<(poVar11," - ");
    this = (void *)std::ostream::operator<<(poVar11,local_40);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    *in_stack_00000010 = local_40;
    *in_stack_00000008 = local_48;
    if (this_00 != (TPZFMatrix<double> *)0x0) {
      uVar3 = *puVar5;
      pTVar15 = this_00 + uVar3;
      if (this_00 != pTVar15) {
        do {
          pTVar15 = pTVar15 + -1;
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de608);
        } while (pTVar15 != this_00);
      }
      operator_delete__(puVar5,uVar3 * 0x90 + 8);
    }
    local_4 = 0;
  }
  else {
    *in_stack_00000010 = local_40;
    TPZFMatrix<double>::operator+=(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    *in_stack_00000008 = 0;
    local_4 = 0;
  }
LAB_012de709:
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de716);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de723);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de730);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de73d);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de74a);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x12de757);
  return local_4;
}

Assistant:

int 
GMRES( Operator &A, Vector &x, const Vector &b,
	  Preconditioner &M, Matrix &H, int &m, int64_t &max_iter,
	  Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	int64_t j = 1, k;
	Vector s(m+1), cs(m+1), sn(m+1), w1,w;
	
	//  Real normb = norm(M.Solve(b));
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
    M.Solve(b,r);
	Real normb = TPZExtractVal::val(Norm(r));	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    } 
    else 
    {
		x.Zero();
		r = b;
	}
	M.Solve(r,w);
	r=w;
	Real beta = TPZExtractVal::val(Norm(r));
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = ((Real)TPZExtractVal::val(Norm(r))) / normb) <= tol) {
		tol = resid;
		x+=r;
		max_iter = 0;
		return 0;
	}
	
	Vector *v = new Vector[m+1];
	
	while (j <= max_iter) {
        int64_t rows = r.Rows();
        v[0].Resize(rows,1);
        for (int64_t i=0; i<rows; i++) {
            v[0](i) = TPZExtractVal::val(r(i)) * ((Real)(1.0/beta));
        }
        int64_t srows = s.Rows();
        for (int64_t i=0; i<srows; i++) {
            s(i) = REAL(0.);
        }
//		v[0] = r * (REAL(1.0 / beta));    // ??? r / beta
//		s = REAL(0.0);
		s(0) = beta;
		
		for (int64_t i = 0; i < m && j <= max_iter; i++, j++) {
			A.Multiply(v[i],w1);
			M.Solve(w1,w);
			for (k = 0; k <= i; k++) {
				H(k, i) = Dot(w, v[k]);
				w.ZAXPY(-H(k, i), v[k]);
			}
			H(i+1, i) = Norm(w);
			v[i+1] = w;
			v[i+1] *= (1.0)/TPZExtractVal::val(H(i+1,i));
			
			for (k = 0; k < i; k++)
				ApplyPlaneRotation(H(k,i), H(k+1,i), cs(k), sn(k));
			
			GeneratePlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(s(i), s(i+1), cs(i), sn(i));
			resid = ((Real)fabs(s(i+1)))/normb;
			if (resid < tol) {
				Update(x, i, H, s, v);
				tol = resid;
				max_iter = j;
				delete [] v;
				return 0;
			}
		}
		Update(x, m - 1, H, s, v);
		A.MultAdd(x,b,r,-1.,1.);
		M.Solve(r,r);
		beta = TPZExtractVal::val(Norm(r));
        resid = beta/normb;
		if (resid < tol) {
            std::cout << "iter " << j << " - " << resid << std::endl;
			tol = resid;
			max_iter = j;
			delete [] v;
			return 0;
		}
	}
	
	tol = resid;
	delete [] v;
	return 1;
}